

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O3

void etdc_new_symbol(etdc_table **table,uint s)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_handle *pUVar4;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  etdc_table *peVar7;
  UT_hash_table *pUVar8;
  etdc_table *peVar9;
  UT_hash_bucket *pUVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  char *_hj_key;
  
  peVar7 = (etdc_table *)malloc(0x50);
  peVar7->symbol = s;
  peVar7->freq = 1;
  pUVar1 = &peVar7->hh;
  (peVar7->hh).next = (void *)0x0;
  (peVar7->hh).key = peVar7;
  (peVar7->hh).keylen = 4;
  if (*table == (etdc_table *)0x0) {
    *table = peVar7;
    (peVar7->hh).prev = (void *)0x0;
    pUVar8 = (UT_hash_table *)calloc(1,0x40);
    (peVar7->hh).tbl = pUVar8;
    if (pUVar8 == (UT_hash_table *)0x0) goto LAB_00101bd3;
    pUVar8->tail = pUVar1;
    pUVar8->num_buckets = 0x20;
    pUVar8->log2_num_buckets = 5;
    pUVar8->hho = 0x18;
    pUVar10 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar8->buckets = pUVar10;
    if (pUVar10 == (UT_hash_bucket *)0x0) goto LAB_00101bd3;
    pUVar8->signature = 0xa0111fe1;
    peVar9 = peVar7;
  }
  else {
    (((*table)->hh).tbl)->tail->next = peVar7;
    pUVar8 = ((*table)->hh).tbl;
    (peVar7->hh).prev = (void *)((long)pUVar8->tail - pUVar8->hho);
    pUVar8->tail = pUVar1;
    pUVar8 = ((*table)->hh).tbl;
    peVar9 = *table;
  }
  uVar14 = pUVar8->num_items + 1;
  pUVar8->num_items = uVar14;
  (peVar7->hh).tbl = pUVar8;
  uVar12 = (int)(char)peVar7->symbol +
           *(char *)((long)&peVar7->symbol + 1) * 0x100 +
           *(char *)((long)&peVar7->symbol + 2) * 0x10000 +
           (uint)*(byte *)((long)&peVar7->symbol + 3) * 0x1000000 + 0x112410d ^ 0x7f76d;
  uVar11 = uVar12 << 8 ^ 0x9f49bac6 - uVar12;
  uVar15 = uVar11 >> 0xd ^ (-0x112410d - uVar12) - uVar11;
  uVar17 = uVar15 >> 0xc ^ (uVar12 - uVar11) - uVar15;
  uVar12 = uVar17 << 0x10 ^ (uVar11 - uVar15) - uVar17;
  uVar11 = uVar12 >> 5 ^ (uVar15 - uVar17) - uVar12;
  uVar15 = uVar11 >> 3 ^ (uVar17 - uVar12) - uVar11;
  uVar12 = uVar15 << 10 ^ (uVar12 - uVar11) - uVar15;
  uVar11 = uVar12 >> 0xf ^ uVar11 - (uVar15 + uVar12);
  (peVar7->hh).hashv = uVar11;
  pUVar3 = (peVar9->hh).tbl;
  uVar11 = pUVar3->num_buckets - 1 & uVar11;
  pUVar10 = pUVar3->buckets;
  pUVar10[uVar11].count = pUVar10[uVar11].count + 1;
  pUVar4 = pUVar10[uVar11].hh_head;
  (peVar7->hh).hh_next = pUVar4;
  (peVar7->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar4 != (UT_hash_handle *)0x0) {
    pUVar4->hh_prev = pUVar1;
    pUVar10 = (((*table)->hh).tbl)->buckets;
  }
  pUVar10[uVar11].hh_head = pUVar1;
  pUVar10 = (((*table)->hh).tbl)->buckets;
  if ((pUVar10[uVar11].expand_mult * 10 + 10 <= pUVar10[uVar11].count) && (pUVar8->noexpand != 1)) {
    uVar11 = pUVar8->num_buckets;
    pUVar10 = (UT_hash_bucket *)calloc(1,(ulong)(uVar11 * 2) << 4);
    if (pUVar10 == (UT_hash_bucket *)0x0) {
LAB_00101bd3:
      exit(-1);
    }
    uVar15 = uVar11 * 2 - 1;
    uVar12 = ((uVar14 >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar15 & uVar14) == 0);
    pUVar8->ideal_chain_maxlen = uVar12;
    pUVar8->nonideal_items = 0;
    __ptr = pUVar8->buckets;
    if ((ulong)uVar11 != 0) {
      uVar14 = 0;
      uVar16 = 0;
      do {
        pUVar4 = __ptr[uVar16].hh_head;
        while (pUVar4 != (UT_hash_handle *)0x0) {
          pUVar5 = pUVar4->hh_next;
          uVar13 = pUVar4->hashv & uVar15;
          pUVar2 = pUVar10 + uVar13;
          uVar17 = pUVar10[uVar13].count + 1;
          pUVar10[uVar13].count = uVar17;
          if (uVar12 < uVar17) {
            uVar14 = uVar14 + 1;
            pUVar8->nonideal_items = uVar14;
            pUVar2->expand_mult = uVar17 / uVar12;
          }
          pUVar4->hh_prev = (UT_hash_handle *)0x0;
          pUVar6 = pUVar2->hh_head;
          pUVar4->hh_next = pUVar6;
          if (pUVar6 != (UT_hash_handle *)0x0) {
            pUVar6->hh_prev = pUVar4;
          }
          pUVar2->hh_head = pUVar4;
          pUVar4 = pUVar5;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar11);
    }
    free(__ptr);
    pUVar8 = pUVar1->tbl;
    pUVar8->num_buckets = pUVar8->num_buckets << 1;
    pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
    pUVar8->buckets = pUVar10;
    if (pUVar8->num_items >> 1 < pUVar8->nonideal_items) {
      uVar11 = pUVar8->ineff_expands + 1;
      pUVar8->ineff_expands = uVar11;
      if (1 < uVar11) {
        pUVar8->noexpand = 1;
      }
    }
    else {
      pUVar8->ineff_expands = 0;
    }
  }
  return;
}

Assistant:

void etdc_new_symbol( struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;
  
  e = (struct etdc_table *)malloc(sizeof(struct etdc_table));
  e->symbol = s;
  e->freq = 1;

  //fprintf(stderr, "Adding new symbol to etdc table");
  HASH_ADD_INT(*table, symbol, e);
}